

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdrex.cpp
# Opt level: O0

SQBool sqstd_rex_searchrange
                 (SQRex *exp,SQChar *text_begin,SQChar *text_end,SQChar **out_begin,SQChar **out_end
                 )

{
  SQChar *pSVar1;
  bool local_49;
  SQInteger local_48;
  SQInteger node;
  SQChar *cur;
  SQChar **out_end_local;
  SQChar **out_begin_local;
  SQChar *text_end_local;
  SQChar *text_begin_local;
  SQRex *exp_local;
  
  local_48 = exp->_first;
  if (text_begin < text_end) {
    exp->_bol = text_begin;
    exp->_eol = text_end;
    pSVar1 = text_begin;
    do {
      text_end_local = pSVar1;
      node = (SQInteger)text_end_local;
      for (; local_48 != -1; local_48 = exp->_nodes[local_48].next) {
        exp->_currsubexp = 0;
        node = (SQInteger)
               sqstd_rex_matchnode(exp,exp->_nodes + local_48,(SQChar *)node,(SQRexNode *)0x0);
        if ((SQChar *)node == (SQChar *)0x0) break;
      }
      local_49 = node == 0 && text_end_local + 1 != text_end;
      pSVar1 = text_end_local + 1;
    } while (local_49);
    if (node == 0) {
      exp_local = (SQRex *)0x0;
    }
    else {
      if (out_begin != (SQChar **)0x0) {
        *out_begin = text_end_local;
      }
      if (out_end != (SQChar **)0x0) {
        *out_end = (SQChar *)node;
      }
      exp_local = (SQRex *)0x1;
    }
  }
  else {
    exp_local = (SQRex *)0x0;
  }
  return (SQBool)exp_local;
}

Assistant:

SQBool sqstd_rex_searchrange(SQRex* exp,const SQChar* text_begin,const SQChar* text_end,const SQChar** out_begin, const SQChar** out_end)
{
    const SQChar *cur = NULL;
    SQInteger node = exp->_first;
    if(text_begin >= text_end) return SQFalse;
    exp->_bol = text_begin;
    exp->_eol = text_end;
    do {
        cur = text_begin;
        while(node != -1) {
            exp->_currsubexp = 0;
            cur = sqstd_rex_matchnode(exp,&exp->_nodes[node],cur,NULL);
            if(!cur)
                break;
            node = exp->_nodes[node].next;
        }
        text_begin++;
    } while(cur == NULL && text_begin != text_end);

    if(cur == NULL)
        return SQFalse;

    --text_begin;

    if(out_begin) *out_begin = text_begin;
    if(out_end) *out_end = cur;
    return SQTrue;
}